

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleType.cpp
# Opt level: O3

void __thiscall hdc::DoubleType::DoubleType(DoubleType *this,Token *token)

{
  int iVar1;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00196648;
  (this->token).lexem._M_dataplus._M_p = (pointer)&(this->token).lexem.field_2;
  (this->token).lexem._M_string_length = 0;
  (this->token).lexem.field_2._M_local_buf[0] = '\0';
  iVar1 = token->line;
  (this->token).kind = token->kind;
  (this->token).line = iVar1;
  (this->token).column = token->column;
  std::__cxx11::string::_M_assign((string *)&(this->token).lexem);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_DOUBLE_TYPE;
  return;
}

Assistant:

DoubleType::DoubleType(Token& token) {
    this->token = token;
    this->kind = AST_DOUBLE_TYPE;
}